

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O3

Var Js::RegexHelper::RegexEs5Replace
              (ScriptContext *entryFunctionContext,JavascriptRegExp *regularExpression,
              JavascriptString *input,JavascriptString *replace,bool noResult)

{
  Var value;
  void *pvVar1;
  
  value = RegexEs5ReplaceImpl(entryFunctionContext,regularExpression,input,replace,noResult);
  pvVar1 = CheckCrossContextAndMarshalResult<void*>(value,entryFunctionContext);
  return pvVar1;
}

Assistant:

Var RegexHelper::RegexEs5Replace(ScriptContext* entryFunctionContext, JavascriptRegExp* regularExpression, JavascriptString* input, JavascriptString* replace, bool noResult)
    {
        // We can have RegexReplaceResult... functions defer their job to RegexReplace. However, their regularExpression argument
        // would first be cast to RecyclableObject when the call is made, and then back to JavascriptRegExp in RegexReplaceImpl.
        // The conversion back slows down the perf, so we use this ES5 version of RegexReplace in RegexReplaceResult... if we know
        // that the ES6 logic isn't needed.

        Var result = RegexHelper::RegexEs5ReplaceImpl(entryFunctionContext, regularExpression, input, replace, noResult);
        return RegexHelper::CheckCrossContextAndMarshalResult(result, entryFunctionContext);
    }